

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O0

int envy_bios_parse_bit_A(envy_bios *bios,envy_bios_bit_entry *bit)

{
  int iVar1;
  int iVar2;
  int err;
  int wantlen;
  envy_bios_dacload *dacload;
  envy_bios_bit_entry *bit_local;
  envy_bios *bios_local;
  
  (bios->dacload).bit = bit;
  if (bit->t_len < 3) {
    fprintf(_stderr,"Analog load table too short: %d < %d\n",(ulong)bit->t_len,3);
    bios_local._4_4_ = -0x16;
  }
  else {
    if (3 < bit->t_len) {
      fprintf(_stderr,"Analog load table longer than expected: %d > %d\n",(ulong)bit->t_len,3);
    }
    if ((bios->dacload).valid == '\0') {
      iVar1 = bios_u16(bios,(uint)bit->t_offset,&(bios->dacload).offset);
      iVar2 = bios_u8(bios,bit->t_offset + 2,&(bios->dacload).unk02);
      if (iVar2 == 0 && iVar1 == 0) {
        iVar1 = envy_bios_parse_dacload(bios);
        if (iVar1 != 0) {
          fprintf(_stderr,"Failed to parse DACLOAD table at 0x%04x version %d.%d\n",
                  (ulong)(bios->dacload).offset,
                  (ulong)(uint)((int)(uint)(bios->dacload).version >> 4),
                  (ulong)((bios->dacload).version & 0xf));
        }
        bios_local._4_4_ = 0;
      }
      else {
        bios_local._4_4_ = -0xe;
      }
    }
    else {
      fprintf(_stderr,
              "Found BIT analog table, but DACLOAD table already referenced from info table!\n");
      bios_local._4_4_ = -0x11;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_bit_A (struct envy_bios *bios, struct envy_bios_bit_entry *bit) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	dacload->bit = bit;
	int wantlen = 3;
	if (bit->t_len < wantlen) {
		ENVY_BIOS_ERR("Analog load table too short: %d < %d\n", bit->t_len, wantlen);
		return -EINVAL;
	}
	if (bit->t_len > wantlen)
		ENVY_BIOS_WARN("Analog load table longer than expected: %d > %d\n", bit->t_len, wantlen);
	if (dacload->valid) {
		ENVY_BIOS_ERR("Found BIT analog table, but DACLOAD table already referenced from info table!\n");
		return -EEXIST;
	}
	int err = 0;
	err |= bios_u16(bios, bit->t_offset+0, &dacload->offset);
	err |= bios_u8(bios, bit->t_offset+2, &dacload->unk02);
	if (err)
		return -EFAULT;
	if (envy_bios_parse_dacload(bios))
		ENVY_BIOS_ERR("Failed to parse DACLOAD table at 0x%04x version %d.%d\n", bios->dacload.offset, bios->dacload.version >> 4, bios->dacload.version & 0xf);
	return 0;
}